

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

int ConvexDecomposition::calchullgen(float3 *verts,int verts_count,int vlimit)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int *piVar3;
  undefined8 *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  cbtHullTriangle *pcVar19;
  cbtHullTriangle *t_00;
  cbtHullTriangle *t_01;
  long lVar20;
  char *pcVar21;
  undefined4 in_register_00000014;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  undefined1 auVar26 [56];
  undefined1 auVar25 [64];
  undefined1 extraout_var [60];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [64];
  int4 iVar32;
  float3 fVar33;
  int3 t;
  Array<int> isextreme;
  Array<int> allow;
  float3 local_d0;
  ulong local_c0;
  int local_b4;
  ulong local_b0;
  Array<int> local_a8;
  float local_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  Array<int> local_68;
  cbtHullTriangle *local_50;
  undefined8 local_48;
  float3 local_40;
  
  local_48 = CONCAT44(in_register_00000014,vlimit);
  iVar15 = 0;
  if (3 < verts_count) {
    uVar1 = verts->x;
    uVar2 = verts->y;
    local_88._4_4_ = uVar2;
    local_88._0_4_ = uVar1;
    local_88._8_8_ = 0;
    local_b0 = CONCAT44(local_b0._4_4_,verts->z);
    local_a8._0_12_ = ZEXT812(0);
    local_a8.array_size = 0;
    Array<int>::allocate(&local_a8,verts_count);
    local_68.element = (int *)0x0;
    local_68.count = 0;
    local_68.array_size = 0;
    Array<int>::allocate(&local_68,verts_count);
    auVar31 = ZEXT464((uint)(float)local_b0);
    lVar24 = 0;
    fVar30 = (float)local_b0;
    auVar8 = local_88;
    local_b4 = verts_count;
    do {
      local_b0 = CONCAT44(local_b0._4_4_,auVar31._0_4_);
      local_78 = auVar8;
      local_c0._0_4_ = fVar30;
      Array<int>::Add(&local_68,1);
      Array<int>::Add(&local_a8,0);
      auVar27 = ZEXT416(*(uint *)((long)&verts->x + lVar24));
      auVar5 = vminss_avx(local_88,auVar27);
      auVar8 = vmovshdup_avx(local_88);
      auVar28 = ZEXT416(*(uint *)((long)&verts->y + lVar24));
      auVar6 = vminss_avx(auVar8,auVar28);
      auVar29 = ZEXT416(*(uint *)((long)&verts->z + lVar24));
      auVar7 = vminss_avx(ZEXT416((uint)(float)local_b0),auVar29);
      auVar31 = ZEXT1664(auVar7);
      local_88 = vinsertps_avx(auVar5,auVar6,0x10);
      auVar27 = vmaxss_avx(local_78,auVar27);
      auVar8 = vmovshdup_avx(local_78);
      auVar28 = vmaxss_avx(auVar8,auVar28);
      auVar8 = vmaxss_avx(ZEXT416((uint)(float)local_c0),auVar29);
      fVar30 = auVar8._0_4_;
      local_c0 = CONCAT44(local_c0._4_4_,fVar30);
      auVar8 = vinsertps_avx(auVar27,auVar28,0x10);
      lVar24 = lVar24 + 0xc;
    } while ((ulong)(uint)verts_count * 0xc != lVar24);
    fVar9 = auVar27._0_4_ - auVar5._0_4_;
    fVar10 = auVar28._0_4_ - auVar6._0_4_;
    fVar30 = fVar30 - auVar7._0_4_;
    fVar30 = fVar30 * fVar30 + fVar9 * fVar9 + fVar10 * fVar10;
    if (fVar30 < 0.0) {
      local_8c = sqrtf(fVar30);
    }
    else {
      auVar8 = vsqrtss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
      local_8c = auVar8._0_4_;
    }
    iVar32 = FindSimplex(verts,local_b4,&local_68);
    uVar22 = iVar32._8_8_;
    uVar23 = iVar32._0_8_;
    iVar15 = iVar32.x;
    if (iVar15 == -1) {
      iVar15 = 0;
    }
    else {
      lVar24 = (long)uVar23 >> 0x20;
      iVar16 = iVar32.z;
      lVar20 = (long)uVar22 >> 0x20;
      auVar8 = vinsertps_avx(ZEXT416((uint)((verts[iVar15].x + verts[lVar24].x + verts[iVar16].x +
                                            verts[lVar20].x) * 0.25)),
                             ZEXT416((uint)((verts[iVar15].y + verts[lVar24].y + verts[iVar16].y +
                                            verts[lVar20].y) * 0.25)),0x10);
      auVar31 = ZEXT1664(auVar8);
      local_40.z = (verts[iVar15].z + verts[lVar24].z + verts[iVar16].z + verts[lVar20].z) * 0.25;
      local_40._0_8_ = vmovlps_avx(auVar8);
      pcVar19 = (cbtHullTriangle *)::operator_new(0x24);
      local_88._0_8_ = uVar23;
      local_c0 = uVar23 >> 0x20;
      (pcVar19->super_int3).x = iVar16;
      (pcVar19->super_int3).y = iVar32.w;
      (pcVar19->super_int3).z = iVar32.y;
      (pcVar19->n).x = -1;
      (pcVar19->n).y = -1;
      (pcVar19->n).z = -1;
      pcVar19->id = DAT_00b98040;
      local_b0 = uVar22;
      Array<ConvexDecomposition::cbtHullTriangle_*>::Add
                ((Array<ConvexDecomposition::cbtHullTriangle_*> *)&tris,pcVar19);
      pcVar19->vmax = -1;
      pcVar19->rise = 0.0;
      (pcVar19->n).x = 2;
      (pcVar19->n).y = 3;
      (pcVar19->n).z = 1;
      t_00 = (cbtHullTriangle *)::operator_new(0x24);
      local_78._0_8_ = uVar22 >> 0x20;
      (t_00->super_int3).x = iVar32.w;
      (t_00->super_int3).y = (int)local_b0;
      iVar15 = local_88._0_4_;
      (t_00->super_int3).z = iVar15;
      (t_00->n).x = -1;
      (t_00->n).y = -1;
      (t_00->n).z = -1;
      t_00->id = DAT_00b98040;
      Array<ConvexDecomposition::cbtHullTriangle_*>::Add
                ((Array<ConvexDecomposition::cbtHullTriangle_*> *)&tris,t_00);
      t_00->vmax = -1;
      t_00->rise = 0.0;
      (t_00->n).x = 3;
      (t_00->n).y = 2;
      (t_00->n).z = 0;
      t_01 = (cbtHullTriangle *)::operator_new(0x24);
      (t_01->super_int3).x = iVar15;
      (t_01->super_int3).y = (int)local_c0;
      (t_01->super_int3).z = local_78._0_4_;
      (t_01->n).x = -1;
      (t_01->n).y = -1;
      (t_01->n).z = -1;
      t_01->id = DAT_00b98040;
      local_50 = pcVar19;
      Array<ConvexDecomposition::cbtHullTriangle_*>::Add
                ((Array<ConvexDecomposition::cbtHullTriangle_*> *)&tris,t_01);
      t_01->vmax = -1;
      t_01->rise = 0.0;
      (t_01->n).x = 0;
      (t_01->n).y = 1;
      (t_01->n).z = 3;
      pcVar19 = (cbtHullTriangle *)::operator_new(0x24);
      uVar23 = local_b0;
      (pcVar19->super_int3).x = (int)local_c0;
      (pcVar19->super_int3).y = iVar15;
      uVar18 = (uint)local_b0;
      (pcVar19->super_int3).z = uVar18;
      (pcVar19->n).x = -1;
      (pcVar19->n).y = -1;
      (pcVar19->n).z = -1;
      pcVar19->id = DAT_00b98040;
      Array<ConvexDecomposition::cbtHullTriangle_*>::Add
                ((Array<ConvexDecomposition::cbtHullTriangle_*> *)&tris,pcVar19);
      pcVar19->vmax = -1;
      pcVar19->rise = 0.0;
      (pcVar19->n).x = 1;
      (pcVar19->n).y = 0;
      (pcVar19->n).z = 2;
      if (((long)uVar23 < 0) || (local_a8.count <= local_78._0_4_)) {
LAB_009320bd:
        pcVar21 = "Type &ConvexDecomposition::Array<int>::operator[](int) [Type = int]";
LAB_009320b3:
        __assert_fail("i>=0 && i<count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                      ,0x577,pcVar21);
      }
      local_a8.element[local_78._0_8_] = 1;
      if (((int)uVar18 < 0) ||
         (((local_a8.count <= (int)uVar18 ||
           (local_a8.element[uVar18 & 0x7fffffff] = 1, (long)local_88._0_8_ < 0)) ||
          (local_a8.count <= (int)local_c0)))) goto LAB_009320bd;
      local_a8.element[local_c0] = 1;
      uVar18 = local_88._0_4_;
      if (((int)uVar18 < 0) || (local_a8.count <= (int)uVar18)) goto LAB_009320bd;
      local_a8.element[uVar18 & 0x7fffffff] = 1;
      checkit(local_50);
      checkit(t_00);
      checkit(t_01);
      checkit(pcVar19);
      if (0 < (int)DAT_00b98040) {
        lVar24 = 0;
        do {
          auVar26 = auVar31._8_56_;
          piVar3 = *(int **)(tris + lVar24 * 8);
          if (piVar3 == (int *)0x0) {
            __assert_fail("t",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                          ,0x9dc,"int ConvexDecomposition::calchullgen(float3 *, int, int)");
          }
          if (-1 < piVar3[7]) {
            __assert_fail("t->vmax<0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                          ,0x9dd,"int ConvexDecomposition::calchullgen(float3 *, int, int)");
          }
          fVar33 = TriNormal(verts + *piVar3,verts + piVar3[1],verts + piVar3[2]);
          local_d0.z = fVar33.z;
          auVar31._0_8_ = fVar33._0_8_;
          auVar31._8_56_ = auVar26;
          local_d0._0_8_ = vmovlps_avx(auVar31._0_16_);
          iVar16 = maxdirsterid<ConvexDecomposition::float3>(verts,local_b4,&local_d0,&local_68);
          piVar3[7] = iVar16;
          iVar15 = *piVar3;
          fVar30 = verts[iVar16].x - verts[iVar15].x;
          auVar31 = ZEXT464((uint)fVar30);
          auVar8 = vfmadd231ss_fma(ZEXT416((uint)((verts[iVar16].y - verts[iVar15].y) * local_d0.y))
                                   ,ZEXT416((uint)fVar30),ZEXT416((uint)local_d0.x));
          auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)(verts[iVar16].z - verts[iVar15].z)),
                                   ZEXT416((uint)local_d0.z));
          piVar3[8] = auVar8._0_4_;
          lVar24 = lVar24 + 1;
        } while (lVar24 < (int)DAT_00b98040);
      }
      uVar23 = 0x3b9ac9fc;
      if ((int)local_48 != 0) {
        uVar23 = (ulong)((int)local_48 - 4);
      }
      if (0 < (int)uVar23) {
        fVar30 = local_8c * 0.001;
        local_c0 = CONCAT44(local_c0._4_4_,fVar30 * 0.01);
        local_78._0_4_ = fVar30;
        local_b0 = CONCAT44(local_b0._4_4_,fVar30 * fVar30 * 0.1);
LAB_00931cda:
        auVar25 = ZEXT464((uint)local_78._0_4_);
        pcVar19 = extrudable((float)local_78._0_4_);
        if (pcVar19 != (cbtHullTriangle *)0x0) {
          iVar15 = pcVar19->vmax;
          lVar24 = (long)iVar15;
          if ((-1 < lVar24) && (iVar15 < local_a8.count)) {
            if (local_a8.element[lVar24] != 0) {
              __assert_fail("!isextreme[v]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                            ,0x9e8,"int ConvexDecomposition::calchullgen(float3 *, int, int)");
            }
            local_88._0_8_ = uVar23;
            local_a8.element[lVar24] = 1;
            uVar23 = (ulong)DAT_00b98040;
            uVar18 = DAT_00b98040;
            iVar16 = local_b4;
            if (uVar23 != 0) {
              do {
                iVar16 = (int)uVar23;
                if ((iVar16 < 1) || ((int)DAT_00b98040 < iVar16)) goto LAB_0093209e;
                puVar4 = *(undefined8 **)(tris + -8 + uVar23 * 8);
                if (puVar4 != (undefined8 *)0x0) {
                  local_d0.z = *(float *)(puVar4 + 1);
                  local_d0._0_8_ = *puVar4;
                  auVar25 = ZEXT464((uint)(float)local_c0);
                  iVar17 = above(verts,(int3 *)&local_d0,verts + lVar24,(float)local_c0);
                  if (iVar17 != 0) {
                    if ((int)DAT_00b98040 < iVar16) goto LAB_0093209e;
                    extrude(*(cbtHullTriangle **)(tris + -8 + uVar23 * 8),iVar15);
                  }
                }
                uVar23 = uVar23 - 1;
                uVar18 = DAT_00b98040;
                iVar16 = local_b4;
              } while (uVar23 != 0);
            }
joined_r0x00931da2:
            do {
              uVar14 = uVar18;
              local_b4 = iVar16;
              if (uVar14 == 0) goto LAB_00931f3b;
              if (((int)uVar14 < 1) || ((int)DAT_00b98040 < (int)uVar14)) goto LAB_0093209e;
              uVar18 = uVar14 - 1;
              piVar3 = *(int **)(tris + (ulong)uVar18 * 8);
              if (piVar3 != (int *)0x0) {
                if (((*piVar3 != iVar15) && (piVar3[1] != iVar15)) && (piVar3[2] != iVar15))
                goto LAB_00931f3b;
                local_d0.z = (float)piVar3[2];
                local_d0.x = (float)piVar3[0];
                local_d0.y = (float)piVar3[1];
                auVar25 = ZEXT464((uint)(float)local_c0);
                iVar16 = above(verts,(int3 *)&local_d0,&local_40,(float)local_c0);
                if (iVar16 == 0) {
                  lVar24 = (long)(int)local_d0.y;
                  lVar20 = (long)(int)local_d0.x;
                  fVar30 = verts[lVar24].x - verts[lVar20].x;
                  fVar9 = verts[lVar24].y - verts[lVar20].y;
                  fVar10 = verts[lVar24].z - verts[lVar20].z;
                  lVar20 = (long)(int)local_d0.z;
                  fVar11 = verts[lVar20].x - verts[lVar24].x;
                  fVar12 = verts[lVar20].y - verts[lVar24].y;
                  fVar13 = verts[lVar20].z - verts[lVar24].z;
                  auVar8 = vfmsub231ss_fma(ZEXT416((uint)(fVar12 * fVar10)),ZEXT416((uint)fVar9),
                                           ZEXT416((uint)fVar13));
                  auVar27 = vfmsub231ss_fma(ZEXT416((uint)(fVar13 * fVar30)),ZEXT416((uint)fVar11),
                                            ZEXT416((uint)fVar10));
                  auVar28 = vfmsub231ss_fma(ZEXT416((uint)(fVar11 * fVar9)),ZEXT416((uint)fVar30),
                                            ZEXT416((uint)fVar12));
                  fVar30 = auVar28._0_4_ * auVar28._0_4_ +
                           auVar8._0_4_ * auVar8._0_4_ + auVar27._0_4_ * auVar27._0_4_;
                  if (fVar30 < 0.0) {
                    auVar25._0_4_ = sqrtf(fVar30);
                    auVar25._4_60_ = extraout_var;
                  }
                  else {
                    auVar8 = vsqrtss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
                    auVar25 = ZEXT1664(auVar8);
                  }
                  iVar16 = local_b4;
                  if ((float)local_b0 <= auVar25._0_4_) goto joined_r0x00931da2;
                }
                if ((int)DAT_00b98040 < (int)uVar14) goto LAB_0093209e;
                iVar16 = *(int *)(*(long *)(tris + (ulong)uVar18 * 8) + 0xc);
                if (((long)iVar16 < 0) || ((int)DAT_00b98040 <= iVar16)) goto LAB_0093209e;
                pcVar19 = *(cbtHullTriangle **)(tris + (long)iVar16 * 8);
                if (pcVar19 == (cbtHullTriangle *)0x0) {
                  pcVar21 = "nb";
                }
                else if ((((pcVar19->super_int3).x == iVar15) || ((pcVar19->super_int3).y == iVar15)
                         ) || ((pcVar19->super_int3).z == iVar15)) {
                  pcVar21 = "!hasvert(*nb,v)";
                }
                else {
                  if (pcVar19->id < (int)uVar18) {
                    extrude(pcVar19,iVar15);
                    uVar18 = DAT_00b98040;
                    iVar16 = local_b4;
                    goto joined_r0x00931da2;
                  }
                  pcVar21 = "nb->id<j";
                }
                __assert_fail(pcVar21,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                              ,0x9fe,"int ConvexDecomposition::calchullgen(float3 *, int, int)");
              }
            } while( true );
          }
          goto LAB_009320bd;
        }
      }
LAB_00932063:
      iVar15 = 1;
    }
    if (local_68.element != (int *)0x0) {
      free(local_68.element);
    }
    if (local_a8.element != (int *)0x0) {
      free(local_a8.element);
    }
  }
  return iVar15;
LAB_00931f3b:
  for (uVar23 = (ulong)DAT_00b98040; uVar23 != 0; uVar23 = uVar23 - 1) {
    auVar26 = auVar25._8_56_;
    if (((int)uVar23 < 1) || ((int)DAT_00b98040 < (int)uVar23)) goto LAB_0093209e;
    piVar3 = *(int **)(tris + -8 + uVar23 * 8);
    if (piVar3 != (int *)0x0) {
      if (-1 < piVar3[7]) break;
      fVar33 = TriNormal(verts + *piVar3,verts + piVar3[1],verts + piVar3[2]);
      local_d0.z = fVar33.z;
      auVar25._0_8_ = fVar33._0_8_;
      auVar25._8_56_ = auVar26;
      local_d0._0_8_ = vmovlps_avx(auVar25._0_16_);
      uVar18 = maxdirsterid<ConvexDecomposition::float3>(verts,iVar16,&local_d0,&local_68);
      piVar3[7] = uVar18;
      if (((int)uVar18 < 0) || (local_a8.count <= (int)uVar18)) goto LAB_009320bd;
      if (local_a8.element[uVar18] == 0) {
        iVar15 = *piVar3;
        fVar30 = verts[uVar18].x - verts[iVar15].x;
        auVar25 = ZEXT464((uint)fVar30);
        auVar8 = vfmadd231ss_fma(ZEXT416((uint)((verts[uVar18].y - verts[iVar15].y) * local_d0.y)),
                                 ZEXT416((uint)fVar30),ZEXT416((uint)local_d0.x));
        auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)(verts[uVar18].z - verts[iVar15].z)),
                                 ZEXT416((uint)local_d0.z));
        piVar3[8] = auVar8._0_4_;
      }
      else {
        piVar3[7] = -1;
      }
    }
  }
  uVar23 = (ulong)(local_88._0_4_ - 1);
  if (local_88._0_4_ < 2) goto LAB_00932063;
  goto LAB_00931cda;
LAB_0093209e:
  pcVar21 = 
  "Type &ConvexDecomposition::Array<ConvexDecomposition::cbtHullTriangle *>::operator[](int) [Type = ConvexDecomposition::cbtHullTriangle *]"
  ;
  goto LAB_009320b3;
}

Assistant:

int calchullgen(float3 *verts,int verts_count, int vlimit)
{
	if(verts_count <4) return 0;
	if(vlimit==0) vlimit=1000000000;
	int j;
	float3 bmin(*verts),bmax(*verts);
	Array<int> isextreme(verts_count);
	Array<int> allow(verts_count);
	for(j=0;j<verts_count;j++) 
	{
		allow.Add(1);
		isextreme.Add(0);
		bmin = VectorMin(bmin,verts[j]);
		bmax = VectorMax(bmax,verts[j]);
	}
	float epsilon = magnitude(bmax-bmin) * 0.001f;


	int4 p = FindSimplex(verts,verts_count,allow);
	if(p.x==-1) return 0; // simplex failed



	float3 center = (verts[p[0]]+verts[p[1]]+verts[p[2]]+verts[p[3]]) /4.0f;  // a valid interior point
	cbtHullTriangle *t0 = new cbtHullTriangle(p[2],p[3],p[1]); t0->n=int3(2,3,1);
	cbtHullTriangle *t1 = new cbtHullTriangle(p[3],p[2],p[0]); t1->n=int3(3,2,0);
	cbtHullTriangle *t2 = new cbtHullTriangle(p[0],p[1],p[3]); t2->n=int3(0,1,3);
	cbtHullTriangle *t3 = new cbtHullTriangle(p[1],p[0],p[2]); t3->n=int3(1,0,2);
	isextreme[p[0]]=isextreme[p[1]]=isextreme[p[2]]=isextreme[p[3]]=1;
	checkit(t0);checkit(t1);checkit(t2);checkit(t3);

	for(j=0;j<tris.count;j++)
	{
		cbtHullTriangle *t=tris[j];
		assert(t);
		assert(t->vmax<0);
		float3 n=TriNormal(verts[(*t)[0]],verts[(*t)[1]],verts[(*t)[2]]);
		t->vmax = maxdirsterid(verts,verts_count,n,allow);
		t->rise = dot(n,verts[t->vmax]-verts[(*t)[0]]);
	}
	cbtHullTriangle *te;
	vlimit-=4;
	while(vlimit >0 && (te=extrudable(epsilon)))
	{
		int3 ti=*te;
		int v=te->vmax;
		assert(!isextreme[v]);  // wtf we've already done this vertex
		isextreme[v]=1;
		//if(v==p0 || v==p1 || v==p2 || v==p3) continue; // done these already
		j=tris.count;
		while(j--) {
			if(!tris[j]) continue;
			int3 t=*tris[j];
			if(above(verts,t,verts[v],0.01f*epsilon)) 
			{
				extrude(tris[j],v);
			}
		}
		// now check for those degenerate cases where we have a flipped triangle or a really skinny triangle
		j=tris.count;
		while(j--)
		{
			if(!tris[j]) continue;
			if(!hasvert(*tris[j],v)) break;
			int3 nt=*tris[j];
			if(above(verts,nt,center,0.01f*epsilon)  || magnitude(cross(verts[nt[1]]-verts[nt[0]],verts[nt[2]]-verts[nt[1]]))< epsilon*epsilon*0.1f )
			{
				cbtHullTriangle *nb = tris[tris[j]->n[0]];
				assert(nb);assert(!hasvert(*nb,v));assert(nb->id<j);
				extrude(nb,v);
				j=tris.count; 
			}
		} 
		j=tris.count;
		while(j--)
		{
			cbtHullTriangle *t=tris[j];
			if(!t) continue;
			if(t->vmax>=0) break;
			float3 n=TriNormal(verts[(*t)[0]],verts[(*t)[1]],verts[(*t)[2]]);
			t->vmax = maxdirsterid(verts,verts_count,n,allow);
			if(isextreme[t->vmax]) 
			{
				t->vmax=-1; // already done that vertex - algorithm needs to be able to terminate.
			}
			else
			{
				t->rise = dot(n,verts[t->vmax]-verts[(*t)[0]]);
			}
		}
		vlimit --;
	}
	return 1;
}